

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Scene *pSVar10;
  Ref<embree::Geometry> *pRVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  uint uVar43;
  undefined4 uVar44;
  AABBNodeMB4D *node1;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  int iVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  ulong *puVar52;
  ulong *puVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  long lVar72;
  ulong uVar73;
  bool bVar74;
  bool bVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  vint4 bi;
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  vint4 ai;
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar106;
  float fVar110;
  float fVar111;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar112;
  undefined1 auVar109 [32];
  uint uVar116;
  uint uVar117;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  uint uVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [32];
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_cb0;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  undefined1 local_b60 [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined4 uStack_9a4;
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar92._4_4_ = fVar1;
  auVar92._0_4_ = fVar1;
  auVar92._8_4_ = fVar1;
  auVar92._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar96._4_4_ = fVar2;
  auVar96._0_4_ = fVar2;
  auVar96._8_4_ = fVar2;
  auVar96._12_4_ = fVar2;
  fVar119 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar98._4_4_ = fVar119;
  auVar98._0_4_ = fVar119;
  auVar98._8_4_ = fVar119;
  auVar98._12_4_ = fVar119;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar119 = fVar119 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar101._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar101._8_4_ = -fVar1;
  auVar101._12_4_ = -fVar1;
  auVar107._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar107._8_4_ = -fVar2;
  auVar107._12_4_ = -fVar2;
  iVar48 = (tray->tnear).field_0.i[k];
  auVar113._4_4_ = iVar48;
  auVar113._0_4_ = iVar48;
  auVar113._8_4_ = iVar48;
  auVar113._12_4_ = iVar48;
  iVar48 = (tray->tfar).field_0.i[k];
  auVar123._4_4_ = iVar48;
  auVar123._0_4_ = iVar48;
  auVar123._8_4_ = iVar48;
  auVar123._12_4_ = iVar48;
  local_b60._16_16_ = mm_lookupmask_ps._240_16_;
  local_b60._0_16_ = mm_lookupmask_ps._0_16_;
  auVar127._0_8_ = CONCAT44(fVar119,fVar119) ^ 0x8000000080000000;
  auVar127._8_4_ = -fVar119;
  auVar127._12_4_ = -fVar119;
  uVar43 = 1 << ((uint)k & 0x1f);
  uVar45 = (ulong)uVar43;
  auVar105._4_4_ = uVar43;
  auVar105._0_4_ = uVar43;
  auVar105._8_4_ = uVar43;
  auVar105._12_4_ = uVar43;
  auVar105._16_4_ = uVar43;
  auVar105._20_4_ = uVar43;
  auVar105._24_4_ = uVar43;
  auVar105._28_4_ = uVar43;
  auVar79 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar105 = vpand_avx2(auVar105,auVar79);
  local_ba0 = vpcmpeqd_avx2(auVar105,auVar79);
  auVar85._8_4_ = 0x3f800000;
  auVar85._0_8_ = &DAT_3f8000003f800000;
  auVar85._12_4_ = 0x3f800000;
  auVar85._16_4_ = 0x3f800000;
  auVar85._20_4_ = 0x3f800000;
  auVar85._24_4_ = 0x3f800000;
  auVar85._28_4_ = 0x3f800000;
  auVar79._8_4_ = 0xbf800000;
  auVar79._0_8_ = 0xbf800000bf800000;
  auVar79._12_4_ = 0xbf800000;
  auVar79._16_4_ = 0xbf800000;
  auVar79._20_4_ = 0xbf800000;
  auVar79._24_4_ = 0xbf800000;
  auVar79._28_4_ = 0xbf800000;
  _local_b80 = vblendvps_avx(auVar85,auVar79,local_b60);
  puVar53 = local_7f8;
  do {
    puVar52 = puVar53;
    if (puVar52 == &local_800) break;
    puVar53 = puVar52 + -1;
    uVar70 = puVar52[-1];
    do {
      if ((uVar70 & 8) == 0) {
        uVar45 = uVar70 & 0xfffffffffffffff0;
        uVar44 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar76._4_4_ = uVar44;
        auVar76._0_4_ = uVar44;
        auVar76._8_4_ = uVar44;
        auVar76._12_4_ = uVar44;
        auVar77 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar45 + 0x80 + uVar51),auVar76,
                                  *(undefined1 (*) [16])(uVar45 + 0x20 + uVar51));
        auVar77 = vfmadd213ps_fma(auVar77,auVar92,auVar101);
        auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar45 + 0x80 + uVar60),auVar76,
                                  *(undefined1 (*) [16])(uVar45 + 0x20 + uVar60));
        auVar22 = vfmadd213ps_fma(auVar22,auVar96,auVar107);
        auVar77 = vpmaxsd_avx(auVar77,auVar22);
        auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar45 + 0x80 + uVar64),auVar76,
                                  *(undefined1 (*) [16])(uVar45 + 0x20 + uVar64));
        auVar22 = vfmadd213ps_fma(auVar22,auVar98,auVar127);
        auVar22 = vpmaxsd_avx(auVar22,auVar113);
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar45 + 0x80 + (uVar51 ^ 0x10)),auVar76,
                                  *(undefined1 (*) [16])(uVar45 + 0x20 + (uVar51 ^ 0x10)));
        auVar77 = vpmaxsd_avx(auVar77,auVar22);
        auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar45 + 0x80 + (uVar60 ^ 0x10)),auVar76,
                                  *(undefined1 (*) [16])(uVar45 + 0x20 + (uVar60 ^ 0x10)));
        auVar23 = vfmadd213ps_fma(auVar23,auVar92,auVar101);
        auVar22 = vfmadd213ps_fma(auVar22,auVar96,auVar107);
        auVar22 = vpminsd_avx(auVar23,auVar22);
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar45 + 0x80 + (uVar64 ^ 0x10)),auVar76,
                                  *(undefined1 (*) [16])(uVar45 + 0x20 + (uVar64 ^ 0x10)));
        auVar23 = vfmadd213ps_fma(auVar23,auVar98,auVar127);
        auVar23 = vpminsd_avx(auVar23,auVar123);
        auVar22 = vpminsd_avx(auVar22,auVar23);
        if (((uint)uVar70 & 7) == 6) {
          auVar22 = vcmpps_avx(auVar77,auVar22,2);
          auVar77 = vcmpps_avx(*(undefined1 (*) [16])(uVar45 + 0xe0),auVar76,2);
          auVar23 = vcmpps_avx(auVar76,*(undefined1 (*) [16])(uVar45 + 0xf0),1);
          auVar77 = vandps_avx(auVar77,auVar23);
          auVar77 = vandps_avx(auVar77,auVar22);
        }
        else {
          auVar77 = vcmpps_avx(auVar77,auVar22,2);
        }
        auVar77 = vpslld_avx(auVar77,0x1f);
        uVar44 = vmovmskps_avx(auVar77);
        uVar45 = CONCAT44((int)(uVar45 >> 0x20),uVar44);
      }
      if ((uVar70 & 8) == 0) {
        if (uVar45 == 0) {
          uVar43 = 4;
        }
        else {
          uVar69 = uVar70 & 0xfffffffffffffff0;
          lVar49 = 0;
          for (uVar70 = uVar45; uVar46 = uVar45, (uVar70 & 1) == 0;
              uVar70 = uVar70 >> 1 | 0x8000000000000000) {
            lVar49 = lVar49 + 1;
          }
          while( true ) {
            uVar46 = uVar46 - 1 & uVar46;
            uVar70 = *(ulong *)(uVar69 + lVar49 * 8);
            if (uVar46 == 0) break;
            *puVar53 = uVar70;
            puVar53 = puVar53 + 1;
            lVar49 = 0;
            for (uVar70 = uVar46; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
              lVar49 = lVar49 + 1;
            }
          }
          uVar43 = 0;
        }
      }
      else {
        uVar43 = 6;
      }
    } while (uVar43 == 0);
    if (uVar43 == 6) {
      uVar69 = (ulong)((uint)uVar70 & 0xf);
      uVar43 = 0;
      uVar46 = uVar69 - 8;
      bVar74 = uVar69 != 8;
      if (bVar74) {
        uVar70 = uVar70 & 0xfffffffffffffff0;
        uVar69 = 0;
        do {
          lVar47 = uVar69 * 0x60;
          pSVar10 = context->scene;
          pRVar11 = (pSVar10->geometries).items;
          pGVar12 = pRVar11[*(uint *)(uVar70 + 0x40 + lVar47)].ptr;
          fVar1 = (pGVar12->time_range).lower;
          fVar1 = pGVar12->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar12->time_range).upper - fVar1))
          ;
          auVar77 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
          auVar77 = vminss_avx(auVar77,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
          auVar16 = vmaxss_avx(ZEXT816(0) << 0x20,auVar77);
          iVar48 = (int)auVar16._0_4_;
          lVar62 = (long)iVar48 * 0x38;
          lVar49 = *(long *)(*(long *)&pGVar12[2].numPrimitives + lVar62);
          uVar61 = (ulong)*(uint *)(uVar70 + 4 + lVar47);
          auVar77 = *(undefined1 (*) [16])(lVar49 + (ulong)*(uint *)(uVar70 + lVar47) * 4);
          uVar54 = (ulong)*(uint *)(uVar70 + 0x10 + lVar47);
          auVar22 = *(undefined1 (*) [16])(lVar49 + uVar54 * 4);
          uVar50 = (ulong)*(uint *)(uVar70 + 0x20 + lVar47);
          auVar23 = *(undefined1 (*) [16])(lVar49 + uVar50 * 4);
          uVar55 = (ulong)*(uint *)(uVar70 + 0x30 + lVar47);
          auVar76 = *(undefined1 (*) [16])(lVar49 + uVar55 * 4);
          lVar49 = *(long *)&pRVar11[*(uint *)(uVar70 + 0x44 + lVar47)].ptr[2].numPrimitives;
          lVar13 = *(long *)(lVar49 + lVar62);
          auVar4 = *(undefined1 (*) [16])(lVar13 + uVar61 * 4);
          uVar56 = (ulong)*(uint *)(uVar70 + 0x14 + lVar47);
          auVar78 = *(undefined1 (*) [16])(lVar13 + uVar56 * 4);
          uVar57 = (ulong)*(uint *)(uVar70 + 0x24 + lVar47);
          auVar5 = *(undefined1 (*) [16])(lVar13 + uVar57 * 4);
          uVar58 = (ulong)*(uint *)(uVar70 + 0x34 + lVar47);
          auVar6 = *(undefined1 (*) [16])(lVar13 + uVar58 * 4);
          lVar13 = *(long *)&pRVar11[*(uint *)(uVar70 + 0x48 + lVar47)].ptr[2].numPrimitives;
          lVar14 = *(long *)(lVar13 + lVar62);
          uVar59 = (ulong)*(uint *)(uVar70 + 8 + lVar47);
          auVar7 = *(undefined1 (*) [16])(lVar14 + uVar59 * 4);
          uVar71 = (ulong)*(uint *)(uVar70 + 0x18 + lVar47);
          auVar8 = *(undefined1 (*) [16])(lVar14 + uVar71 * 4);
          uVar65 = (ulong)*(uint *)(uVar70 + 0x28 + lVar47);
          auVar9 = *(undefined1 (*) [16])(lVar14 + uVar65 * 4);
          uVar66 = (ulong)*(uint *)(uVar70 + 0x38 + lVar47);
          auVar87 = *(undefined1 (*) [16])(lVar14 + uVar66 * 4);
          fVar1 = fVar1 - auVar16._0_4_;
          lVar14 = *(long *)&pRVar11[*(uint *)(uVar70 + 0x4c + lVar47)].ptr[2].numPrimitives;
          lVar62 = *(long *)(lVar14 + lVar62);
          uVar73 = (ulong)*(uint *)(uVar70 + 0xc + lVar47);
          auVar16 = *(undefined1 (*) [16])(lVar62 + uVar73 * 4);
          uVar68 = (ulong)*(uint *)(uVar70 + 0x1c + lVar47);
          auVar97 = *(undefined1 (*) [16])(lVar62 + uVar68 * 4);
          auVar84 = vunpcklps_avx(auVar77,auVar7);
          auVar7 = vunpckhps_avx(auVar77,auVar7);
          auVar90 = vunpcklps_avx(auVar4,auVar16);
          auVar4 = vunpckhps_avx(auVar4,auVar16);
          uVar63 = (ulong)*(uint *)(uVar70 + 0x2c + lVar47);
          auVar77 = *(undefined1 (*) [16])(lVar62 + uVar63 * 4);
          local_bc0 = vunpcklps_avx(auVar7,auVar4);
          local_c00 = vunpcklps_avx(auVar84,auVar90);
          local_be0 = vunpckhps_avx(auVar84,auVar90);
          auVar7 = vunpcklps_avx(auVar22,auVar8);
          auVar4 = vunpckhps_avx(auVar22,auVar8);
          auVar8 = vunpcklps_avx(auVar78,auVar97);
          auVar78 = vunpckhps_avx(auVar78,auVar97);
          uVar67 = (ulong)*(uint *)(uVar70 + 0x3c + lVar47);
          auVar22 = *(undefined1 (*) [16])(lVar62 + uVar67 * 4);
          local_bb0 = vunpcklps_avx(auVar4,auVar78);
          local_bf0 = vunpcklps_avx(auVar7,auVar8);
          local_bd0 = vunpckhps_avx(auVar7,auVar8);
          auVar78 = vunpcklps_avx(auVar23,auVar9);
          auVar23 = vunpckhps_avx(auVar23,auVar9);
          auVar7 = vunpcklps_avx(auVar5,auVar77);
          auVar4 = vunpckhps_avx(auVar5,auVar77);
          lVar72 = (long)(iVar48 + 1) * 0x38;
          lVar62 = *(long *)(*(long *)&pGVar12[2].numPrimitives + lVar72);
          auVar77 = *(undefined1 (*) [16])(lVar62 + (ulong)*(uint *)(uVar70 + lVar47) * 4);
          local_c10 = vunpcklps_avx(auVar23,auVar4);
          local_c40 = vunpcklps_avx(auVar78,auVar7);
          local_c30 = vunpckhps_avx(auVar78,auVar7);
          auVar4 = vunpcklps_avx(auVar76,auVar87);
          auVar23 = vunpckhps_avx(auVar76,auVar87);
          auVar78 = vunpcklps_avx(auVar6,auVar22);
          auVar76 = vunpckhps_avx(auVar6,auVar22);
          lVar13 = *(long *)(lVar13 + lVar72);
          auVar22 = *(undefined1 (*) [16])(lVar13 + uVar59 * 4);
          local_c20 = vunpcklps_avx(auVar23,auVar76);
          auVar5 = vunpcklps_avx(auVar4,auVar78);
          local_c50 = vunpckhps_avx(auVar4,auVar78);
          lVar49 = *(long *)(lVar49 + lVar72);
          auVar76 = vunpcklps_avx(auVar77,auVar22);
          auVar23 = vunpckhps_avx(auVar77,auVar22);
          auVar77 = *(undefined1 (*) [16])(lVar49 + uVar61 * 4);
          lVar14 = *(long *)(lVar14 + lVar72);
          auVar22 = *(undefined1 (*) [16])(lVar14 + uVar73 * 4);
          auVar4 = vunpcklps_avx(auVar77,auVar22);
          auVar77 = vunpckhps_avx(auVar77,auVar22);
          auVar6 = vunpcklps_avx(auVar23,auVar77);
          auVar7 = vunpcklps_avx(auVar76,auVar4);
          auVar23 = vunpckhps_avx(auVar76,auVar4);
          auVar77 = *(undefined1 (*) [16])(lVar62 + uVar54 * 4);
          auVar22 = *(undefined1 (*) [16])(lVar13 + uVar71 * 4);
          auVar4 = vunpcklps_avx(auVar77,auVar22);
          auVar76 = vunpckhps_avx(auVar77,auVar22);
          auVar77 = *(undefined1 (*) [16])(lVar49 + uVar56 * 4);
          auVar22 = *(undefined1 (*) [16])(lVar14 + uVar68 * 4);
          auVar78 = vunpcklps_avx(auVar77,auVar22);
          auVar77 = vunpckhps_avx(auVar77,auVar22);
          auVar8 = vunpcklps_avx(auVar76,auVar77);
          auVar9 = vunpcklps_avx(auVar4,auVar78);
          auVar76 = vunpckhps_avx(auVar4,auVar78);
          auVar77 = *(undefined1 (*) [16])(lVar62 + uVar50 * 4);
          auVar22 = *(undefined1 (*) [16])(lVar13 + uVar65 * 4);
          auVar78 = vunpcklps_avx(auVar77,auVar22);
          auVar4 = vunpckhps_avx(auVar77,auVar22);
          auVar77 = *(undefined1 (*) [16])(lVar49 + uVar57 * 4);
          auVar22 = *(undefined1 (*) [16])(lVar14 + uVar63 * 4);
          auVar87 = vunpcklps_avx(auVar77,auVar22);
          auVar77 = vunpckhps_avx(auVar77,auVar22);
          auVar16 = vunpcklps_avx(auVar4,auVar77);
          auVar97 = vunpcklps_avx(auVar78,auVar87);
          auVar4 = vunpckhps_avx(auVar78,auVar87);
          auVar77 = *(undefined1 (*) [16])(lVar62 + uVar55 * 4);
          auVar22 = *(undefined1 (*) [16])(lVar13 + uVar66 * 4);
          auVar87 = vunpcklps_avx(auVar77,auVar22);
          auVar78 = vunpckhps_avx(auVar77,auVar22);
          auVar77 = *(undefined1 (*) [16])(lVar49 + uVar58 * 4);
          auVar22 = *(undefined1 (*) [16])(lVar14 + uVar67 * 4);
          auVar84 = vunpcklps_avx(auVar77,auVar22);
          auVar77 = vunpckhps_avx(auVar77,auVar22);
          auVar22 = vunpcklps_avx(auVar78,auVar77);
          auVar78 = vunpcklps_avx(auVar87,auVar84);
          auVar77 = vunpckhps_avx(auVar87,auVar84);
          fVar2 = 1.0 - fVar1;
          auVar84._4_4_ = fVar2;
          auVar84._0_4_ = fVar2;
          auVar84._8_4_ = fVar2;
          auVar84._12_4_ = fVar2;
          auVar90._0_4_ = fVar1 * auVar7._0_4_;
          auVar90._4_4_ = fVar1 * auVar7._4_4_;
          auVar90._8_4_ = fVar1 * auVar7._8_4_;
          auVar90._12_4_ = fVar1 * auVar7._12_4_;
          auVar7 = vfmadd231ps_fma(auVar90,auVar84,local_c00);
          auVar99._0_4_ = fVar1 * auVar23._0_4_;
          auVar99._4_4_ = fVar1 * auVar23._4_4_;
          auVar99._8_4_ = fVar1 * auVar23._8_4_;
          auVar99._12_4_ = fVar1 * auVar23._12_4_;
          auVar23 = vfmadd231ps_fma(auVar99,auVar84,local_be0);
          auVar93._0_4_ = auVar6._0_4_ * fVar1;
          auVar93._4_4_ = auVar6._4_4_ * fVar1;
          auVar93._8_4_ = auVar6._8_4_ * fVar1;
          auVar93._12_4_ = auVar6._12_4_ * fVar1;
          auVar6 = vfmadd231ps_fma(auVar93,auVar84,local_bc0);
          auVar87._0_4_ = fVar1 * auVar9._0_4_;
          auVar87._4_4_ = fVar1 * auVar9._4_4_;
          auVar87._8_4_ = fVar1 * auVar9._8_4_;
          auVar87._12_4_ = fVar1 * auVar9._12_4_;
          auVar9 = vfmadd231ps_fma(auVar87,auVar84,local_bf0);
          auVar102._0_4_ = fVar1 * auVar76._0_4_;
          auVar102._4_4_ = fVar1 * auVar76._4_4_;
          auVar102._8_4_ = fVar1 * auVar76._8_4_;
          auVar102._12_4_ = fVar1 * auVar76._12_4_;
          auVar76 = vfmadd231ps_fma(auVar102,auVar84,local_bd0);
          auVar129._0_4_ = auVar8._0_4_ * fVar1;
          auVar129._4_4_ = auVar8._4_4_ * fVar1;
          auVar129._8_4_ = auVar8._8_4_ * fVar1;
          auVar129._12_4_ = auVar8._12_4_ * fVar1;
          auVar8 = vfmadd231ps_fma(auVar129,auVar84,local_bb0);
          auVar114._0_4_ = auVar97._0_4_ * fVar1;
          auVar114._4_4_ = auVar97._4_4_ * fVar1;
          auVar114._8_4_ = auVar97._8_4_ * fVar1;
          auVar114._12_4_ = auVar97._12_4_ * fVar1;
          auVar87 = vfmadd231ps_fma(auVar114,auVar84,local_c40);
          auVar126._0_4_ = auVar4._0_4_ * fVar1;
          auVar126._4_4_ = auVar4._4_4_ * fVar1;
          auVar126._8_4_ = auVar4._8_4_ * fVar1;
          auVar126._12_4_ = auVar4._12_4_ * fVar1;
          auVar4 = vfmadd231ps_fma(auVar126,auVar84,local_c30);
          auVar133._0_4_ = auVar16._0_4_ * fVar1;
          auVar133._4_4_ = auVar16._4_4_ * fVar1;
          auVar133._8_4_ = auVar16._8_4_ * fVar1;
          auVar133._12_4_ = auVar16._12_4_ * fVar1;
          auVar16 = vfmadd231ps_fma(auVar133,auVar84,local_c10);
          auVar97._0_4_ = fVar1 * auVar78._0_4_;
          auVar97._4_4_ = fVar1 * auVar78._4_4_;
          auVar97._8_4_ = fVar1 * auVar78._8_4_;
          auVar97._12_4_ = fVar1 * auVar78._12_4_;
          auVar108._0_4_ = auVar77._0_4_ * fVar1;
          auVar108._4_4_ = auVar77._4_4_ * fVar1;
          auVar108._8_4_ = auVar77._8_4_ * fVar1;
          auVar108._12_4_ = auVar77._12_4_ * fVar1;
          auVar78._0_4_ = auVar22._0_4_ * fVar1;
          auVar78._4_4_ = auVar22._4_4_ * fVar1;
          auVar78._8_4_ = auVar22._8_4_ * fVar1;
          auVar78._12_4_ = auVar22._12_4_ * fVar1;
          auVar77 = vfmadd231ps_fma(auVar97,auVar84,auVar5);
          auVar22 = vfmadd231ps_fma(auVar108,auVar84,local_c50);
          lVar49 = uVar70 + 0x40 + lVar47;
          local_b20 = *(undefined8 *)(lVar49 + 0x10);
          uStack_b18 = *(undefined8 *)(lVar49 + 0x18);
          uStack_b10 = local_b20;
          uStack_b08 = uStack_b18;
          lVar47 = uVar70 + 0x50 + lVar47;
          local_b40 = *(undefined8 *)(lVar47 + 0x10);
          uStack_b38 = *(undefined8 *)(lVar47 + 0x18);
          auVar78 = vfmadd231ps_fma(auVar78,auVar84,local_c20);
          uStack_b30 = local_b40;
          uStack_b28 = uStack_b38;
          auVar91._16_16_ = auVar87;
          auVar91._0_16_ = auVar7;
          auVar132._16_16_ = auVar4;
          auVar132._0_16_ = auVar23;
          auVar134._16_16_ = auVar16;
          auVar134._0_16_ = auVar6;
          auVar86._16_16_ = auVar9;
          auVar86._0_16_ = auVar9;
          auVar88._16_16_ = auVar76;
          auVar88._0_16_ = auVar76;
          auVar94._16_16_ = auVar8;
          auVar94._0_16_ = auVar8;
          auVar100._16_16_ = auVar77;
          auVar100._0_16_ = auVar77;
          auVar103._16_16_ = auVar22;
          auVar103._0_16_ = auVar22;
          auVar80._16_16_ = auVar78;
          auVar80._0_16_ = auVar78;
          auVar79 = vsubps_avx(auVar91,auVar86);
          auVar105 = vsubps_avx(auVar132,auVar88);
          auVar85 = vsubps_avx(auVar134,auVar94);
          auVar83 = vsubps_avx(auVar100,auVar91);
          auVar19 = vsubps_avx(auVar103,auVar132);
          auVar20 = vsubps_avx(auVar80,auVar134);
          auVar21._4_4_ = auVar105._4_4_ * auVar20._4_4_;
          auVar21._0_4_ = auVar105._0_4_ * auVar20._0_4_;
          auVar21._8_4_ = auVar105._8_4_ * auVar20._8_4_;
          auVar21._12_4_ = auVar105._12_4_ * auVar20._12_4_;
          auVar21._16_4_ = auVar105._16_4_ * auVar20._16_4_;
          auVar21._20_4_ = auVar105._20_4_ * auVar20._20_4_;
          auVar21._24_4_ = auVar105._24_4_ * auVar20._24_4_;
          auVar21._28_4_ = auVar9._12_4_;
          auVar76 = vfmsub231ps_fma(auVar21,auVar19,auVar85);
          auVar130._0_4_ = auVar85._0_4_ * auVar83._0_4_;
          auVar130._4_4_ = auVar85._4_4_ * auVar83._4_4_;
          auVar130._8_4_ = auVar85._8_4_ * auVar83._8_4_;
          auVar130._12_4_ = auVar85._12_4_ * auVar83._12_4_;
          auVar130._16_4_ = auVar85._16_4_ * auVar83._16_4_;
          auVar130._20_4_ = auVar85._20_4_ * auVar83._20_4_;
          auVar130._24_4_ = auVar85._24_4_ * auVar83._24_4_;
          auVar130._28_4_ = 0;
          auVar4 = vfmsub231ps_fma(auVar130,auVar20,auVar79);
          uVar44 = *(undefined4 *)(ray + k * 4);
          auVar95._4_4_ = uVar44;
          auVar95._0_4_ = uVar44;
          auVar95._8_4_ = uVar44;
          auVar95._12_4_ = uVar44;
          auVar95._16_4_ = uVar44;
          auVar95._20_4_ = uVar44;
          auVar95._24_4_ = uVar44;
          auVar95._28_4_ = uVar44;
          uVar44 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar104._4_4_ = uVar44;
          auVar104._0_4_ = uVar44;
          auVar104._8_4_ = uVar44;
          auVar104._12_4_ = uVar44;
          auVar104._16_4_ = uVar44;
          auVar104._20_4_ = uVar44;
          auVar104._24_4_ = uVar44;
          auVar104._28_4_ = uVar44;
          uVar44 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar81._4_4_ = uVar44;
          auVar81._0_4_ = uVar44;
          auVar81._8_4_ = uVar44;
          auVar81._12_4_ = uVar44;
          auVar81._16_4_ = uVar44;
          auVar81._20_4_ = uVar44;
          auVar81._24_4_ = uVar44;
          auVar81._28_4_ = uVar44;
          fVar1 = *(float *)(ray + k * 4 + 0x80);
          auVar124._4_4_ = fVar1;
          auVar124._0_4_ = fVar1;
          auVar124._8_4_ = fVar1;
          auVar124._12_4_ = fVar1;
          auVar124._16_4_ = fVar1;
          auVar124._20_4_ = fVar1;
          auVar124._24_4_ = fVar1;
          auVar124._28_4_ = fVar1;
          auVar21 = vsubps_avx(auVar91,auVar95);
          fVar2 = *(float *)(ray + k * 4 + 0xa0);
          auVar128._4_4_ = fVar2;
          auVar128._0_4_ = fVar2;
          auVar128._8_4_ = fVar2;
          auVar128._12_4_ = fVar2;
          auVar128._16_4_ = fVar2;
          auVar128._20_4_ = fVar2;
          auVar128._24_4_ = fVar2;
          auVar128._28_4_ = fVar2;
          auVar80 = vsubps_avx(auVar132,auVar104);
          local_a60 = ZEXT1632(auVar4);
          fVar119 = *(float *)(ray + k * 4 + 0xc0);
          auVar131._4_4_ = fVar119;
          auVar131._0_4_ = fVar119;
          auVar131._8_4_ = fVar119;
          auVar131._12_4_ = fVar119;
          auVar131._16_4_ = fVar119;
          auVar131._20_4_ = fVar119;
          auVar131._24_4_ = fVar119;
          auVar131._28_4_ = fVar119;
          auVar81 = vsubps_avx(auVar134,auVar81);
          auVar24._4_4_ = fVar1 * auVar80._4_4_;
          auVar24._0_4_ = fVar1 * auVar80._0_4_;
          auVar24._8_4_ = fVar1 * auVar80._8_4_;
          auVar24._12_4_ = fVar1 * auVar80._12_4_;
          auVar24._16_4_ = fVar1 * auVar80._16_4_;
          auVar24._20_4_ = fVar1 * auVar80._20_4_;
          auVar24._24_4_ = fVar1 * auVar80._24_4_;
          auVar24._28_4_ = uVar44;
          auVar77 = vfmsub231ps_fma(auVar24,auVar21,auVar128);
          auVar25._4_4_ = auVar20._4_4_ * auVar77._4_4_;
          auVar25._0_4_ = auVar20._0_4_ * auVar77._0_4_;
          auVar25._8_4_ = auVar20._8_4_ * auVar77._8_4_;
          auVar25._12_4_ = auVar20._12_4_ * auVar77._12_4_;
          auVar25._16_4_ = auVar20._16_4_ * 0.0;
          auVar25._20_4_ = auVar20._20_4_ * 0.0;
          auVar25._24_4_ = auVar20._24_4_ * 0.0;
          auVar25._28_4_ = auVar20._28_4_;
          auVar82._0_4_ = auVar85._0_4_ * auVar77._0_4_;
          auVar82._4_4_ = auVar85._4_4_ * auVar77._4_4_;
          auVar82._8_4_ = auVar85._8_4_ * auVar77._8_4_;
          auVar82._12_4_ = auVar85._12_4_ * auVar77._12_4_;
          auVar82._16_4_ = auVar85._16_4_ * 0.0;
          auVar82._20_4_ = auVar85._20_4_ * 0.0;
          auVar82._24_4_ = auVar85._24_4_ * 0.0;
          auVar82._28_4_ = 0;
          auVar20._4_4_ = fVar119 * auVar21._4_4_;
          auVar20._0_4_ = fVar119 * auVar21._0_4_;
          auVar20._8_4_ = fVar119 * auVar21._8_4_;
          auVar20._12_4_ = fVar119 * auVar21._12_4_;
          auVar20._16_4_ = fVar119 * auVar21._16_4_;
          auVar20._20_4_ = fVar119 * auVar21._20_4_;
          auVar20._24_4_ = fVar119 * auVar21._24_4_;
          auVar20._28_4_ = auVar85._28_4_;
          auVar22 = vfmsub231ps_fma(auVar20,auVar81,auVar124);
          auVar77 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar22),auVar19);
          auVar22 = vfmadd231ps_fma(auVar82,auVar105,ZEXT1632(auVar22));
          auVar26._4_4_ = auVar79._4_4_ * auVar19._4_4_;
          auVar26._0_4_ = auVar79._0_4_ * auVar19._0_4_;
          auVar26._8_4_ = auVar79._8_4_ * auVar19._8_4_;
          auVar26._12_4_ = auVar79._12_4_ * auVar19._12_4_;
          auVar26._16_4_ = auVar79._16_4_ * auVar19._16_4_;
          auVar26._20_4_ = auVar79._20_4_ * auVar19._20_4_;
          auVar26._24_4_ = auVar79._24_4_ * auVar19._24_4_;
          auVar26._28_4_ = auVar19._28_4_;
          auVar78 = vfmsub231ps_fma(auVar26,auVar83,auVar105);
          auVar19._4_4_ = fVar2 * auVar81._4_4_;
          auVar19._0_4_ = fVar2 * auVar81._0_4_;
          auVar19._8_4_ = fVar2 * auVar81._8_4_;
          auVar19._12_4_ = fVar2 * auVar81._12_4_;
          auVar19._16_4_ = fVar2 * auVar81._16_4_;
          auVar19._20_4_ = fVar2 * auVar81._20_4_;
          auVar19._24_4_ = fVar2 * auVar81._24_4_;
          auVar19._28_4_ = auVar105._28_4_;
          auVar5 = vfmsub231ps_fma(auVar19,auVar80,auVar131);
          fVar1 = auVar78._0_4_;
          fVar2 = auVar78._4_4_;
          auVar27._4_4_ = fVar119 * fVar2;
          auVar27._0_4_ = fVar119 * fVar1;
          fVar17 = auVar78._8_4_;
          auVar27._8_4_ = fVar119 * fVar17;
          fVar18 = auVar78._12_4_;
          auVar27._12_4_ = fVar119 * fVar18;
          auVar27._16_4_ = fVar119 * 0.0;
          auVar27._20_4_ = fVar119 * 0.0;
          auVar27._24_4_ = fVar119 * 0.0;
          auVar27._28_4_ = fVar119;
          auVar23 = vfmadd231ps_fma(auVar27,local_a60,auVar128);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT1632(auVar76),auVar124);
          auVar115._8_4_ = 0x80000000;
          auVar115._0_8_ = 0x8000000080000000;
          auVar115._12_4_ = 0x80000000;
          auVar115._16_4_ = 0x80000000;
          auVar115._20_4_ = 0x80000000;
          auVar115._24_4_ = 0x80000000;
          auVar115._28_4_ = 0x80000000;
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),ZEXT1632(auVar5),auVar83);
          auVar105 = vandps_avx(ZEXT1632(auVar23),auVar115);
          uVar43 = auVar105._0_4_;
          local_b00._0_4_ = (float)(uVar43 ^ auVar77._0_4_);
          uVar116 = auVar105._4_4_;
          local_b00._4_4_ = (float)(uVar116 ^ auVar77._4_4_);
          uVar117 = auVar105._8_4_;
          local_b00._8_4_ = (float)(uVar117 ^ auVar77._8_4_);
          uVar118 = auVar105._12_4_;
          local_b00._12_4_ = (float)(uVar118 ^ auVar77._12_4_);
          fVar119 = auVar105._16_4_;
          local_b00._16_4_ = fVar119;
          fVar120 = auVar105._20_4_;
          local_b00._20_4_ = fVar120;
          fVar121 = auVar105._24_4_;
          local_b00._24_4_ = fVar121;
          fVar122 = auVar105._28_4_;
          local_b00._28_4_ = fVar122;
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar79,ZEXT1632(auVar5));
          local_ae0._0_4_ = (float)(uVar43 ^ auVar77._0_4_);
          local_ae0._4_4_ = (float)(uVar116 ^ auVar77._4_4_);
          local_ae0._8_4_ = (float)(uVar117 ^ auVar77._8_4_);
          local_ae0._12_4_ = (float)(uVar118 ^ auVar77._12_4_);
          local_ae0._16_4_ = fVar119;
          local_ae0._20_4_ = fVar120;
          local_ae0._24_4_ = fVar121;
          local_ae0._28_4_ = fVar122;
          auVar79 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar105 = vcmpps_avx(local_b00,auVar79,5);
          auVar79 = vcmpps_avx(local_ae0,auVar79,5);
          auVar105 = vandps_avx(auVar79,auVar105);
          auVar109._8_4_ = 0x7fffffff;
          auVar109._0_8_ = 0x7fffffff7fffffff;
          auVar109._12_4_ = 0x7fffffff;
          auVar109._16_4_ = 0x7fffffff;
          auVar109._20_4_ = 0x7fffffff;
          auVar109._24_4_ = 0x7fffffff;
          auVar109._28_4_ = 0x7fffffff;
          local_aa0 = vandps_avx(ZEXT1632(auVar23),auVar109);
          auVar79 = vcmpps_avx(ZEXT1632(auVar23),ZEXT1232(ZEXT412(0)) << 0x20,4);
          auVar105 = vandps_avx(auVar79,auVar105);
          auVar83._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
          auVar83._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
          auVar83._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
          auVar83._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
          auVar83._16_4_ = fVar119 + fVar119;
          auVar83._20_4_ = fVar120 + fVar120;
          auVar83._24_4_ = fVar121 + fVar121;
          auVar83._28_4_ = fVar122 + fVar122;
          auVar79 = vcmpps_avx(auVar83,local_aa0,2);
          auVar85 = auVar79 & auVar105;
          if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar85 >> 0x7f,0) != '\0') ||
                (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar85 >> 0xbf,0) != '\0') ||
              (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar85[0x1f] < '\0') {
            auVar105 = vandps_avx(auVar105,auVar79);
            auVar77 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
            auVar28._4_4_ = fVar2 * auVar81._4_4_;
            auVar28._0_4_ = fVar1 * auVar81._0_4_;
            auVar28._8_4_ = fVar17 * auVar81._8_4_;
            auVar28._12_4_ = fVar18 * auVar81._12_4_;
            auVar28._16_4_ = auVar81._16_4_ * 0.0;
            auVar28._20_4_ = auVar81._20_4_ * 0.0;
            auVar28._24_4_ = auVar81._24_4_ * 0.0;
            auVar28._28_4_ = auVar81._28_4_;
            auVar22 = vfmadd213ps_fma(auVar80,local_a60,auVar28);
            auVar22 = vfmadd213ps_fma(auVar21,ZEXT1632(auVar76),ZEXT1632(auVar22));
            local_ac0._0_4_ = (float)(uVar43 ^ auVar22._0_4_);
            local_ac0._4_4_ = (float)(uVar116 ^ auVar22._4_4_);
            local_ac0._8_4_ = (float)(uVar117 ^ auVar22._8_4_);
            local_ac0._12_4_ = (float)(uVar118 ^ auVar22._12_4_);
            local_ac0._16_4_ = fVar119;
            local_ac0._20_4_ = fVar120;
            local_ac0._24_4_ = fVar121;
            local_ac0._28_4_ = fVar122;
            fVar106 = *(float *)(ray + k * 4 + 0x60);
            auVar29._4_4_ = local_aa0._4_4_ * fVar106;
            auVar29._0_4_ = local_aa0._0_4_ * fVar106;
            auVar29._8_4_ = local_aa0._8_4_ * fVar106;
            auVar29._12_4_ = local_aa0._12_4_ * fVar106;
            auVar29._16_4_ = local_aa0._16_4_ * fVar106;
            auVar29._20_4_ = local_aa0._20_4_ * fVar106;
            auVar29._24_4_ = local_aa0._24_4_ * fVar106;
            auVar29._28_4_ = fVar106;
            auVar105 = vcmpps_avx(auVar29,local_ac0,1);
            fVar106 = *(float *)(ray + k * 4 + 0x100);
            auVar30._4_4_ = local_aa0._4_4_ * fVar106;
            auVar30._0_4_ = local_aa0._0_4_ * fVar106;
            auVar30._8_4_ = local_aa0._8_4_ * fVar106;
            auVar30._12_4_ = local_aa0._12_4_ * fVar106;
            auVar30._16_4_ = local_aa0._16_4_ * fVar106;
            auVar30._20_4_ = local_aa0._20_4_ * fVar106;
            auVar30._24_4_ = local_aa0._24_4_ * fVar106;
            auVar30._28_4_ = fVar106;
            auVar79 = vcmpps_avx(local_ac0,auVar30,2);
            auVar105 = vandps_avx(auVar105,auVar79);
            auVar22 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
            auVar77 = vpand_avx(auVar22,auVar77);
            auVar105 = vpmovzxwd_avx2(auVar77);
            auVar105 = vpslld_avx2(auVar105,0x1f);
            if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar105 >> 0x7f,0) != '\0') ||
                  (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar105 >> 0xbf,0) != '\0') ||
                (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar105[0x1f] < '\0') {
              local_a20 = vpsrad_avx2(auVar105,0x1f);
              local_a80 = ZEXT1632(auVar76);
              local_a40 = ZEXT1632(auVar78);
              auVar105 = vrcpps_avx(local_aa0);
              local_940 = local_b60;
              auVar125._8_4_ = 0x3f800000;
              auVar125._0_8_ = &DAT_3f8000003f800000;
              auVar125._12_4_ = 0x3f800000;
              auVar125._16_4_ = 0x3f800000;
              auVar125._20_4_ = 0x3f800000;
              auVar125._24_4_ = 0x3f800000;
              auVar125._28_4_ = 0x3f800000;
              auVar22 = vfnmadd213ps_fma(local_aa0,auVar105,auVar125);
              auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar105,auVar105);
              fVar106 = auVar22._0_4_;
              fVar110 = auVar22._4_4_;
              fVar111 = auVar22._8_4_;
              fVar112 = auVar22._12_4_;
              local_9c0[0] = fVar106 * local_ac0._0_4_;
              local_9c0[1] = fVar110 * local_ac0._4_4_;
              local_9c0[2] = fVar111 * local_ac0._8_4_;
              local_9c0[3] = fVar112 * local_ac0._12_4_;
              fStack_9b0 = fVar119 * 0.0;
              fStack_9ac = fVar120 * 0.0;
              fStack_9a8 = fVar121 * 0.0;
              uStack_9a4 = local_a20._28_4_;
              auVar31._4_4_ = fVar110 * local_b00._4_4_;
              auVar31._0_4_ = fVar106 * local_b00._0_4_;
              auVar31._8_4_ = fVar111 * local_b00._8_4_;
              auVar31._12_4_ = fVar112 * local_b00._12_4_;
              auVar31._16_4_ = fVar119 * 0.0;
              auVar31._20_4_ = fVar120 * 0.0;
              auVar31._24_4_ = fVar121 * 0.0;
              auVar31._28_4_ = local_a20._28_4_;
              auVar105 = vminps_avx(auVar31,auVar125);
              auVar32._4_4_ = fVar110 * local_ae0._4_4_;
              auVar32._0_4_ = fVar106 * local_ae0._0_4_;
              auVar32._8_4_ = fVar111 * local_ae0._8_4_;
              auVar32._12_4_ = fVar112 * local_ae0._12_4_;
              auVar32._16_4_ = fVar119 * 0.0;
              auVar32._20_4_ = fVar120 * 0.0;
              auVar32._24_4_ = fVar121 * 0.0;
              auVar32._28_4_ = fVar122;
              auVar79 = vminps_avx(auVar32,auVar125);
              auVar85 = vsubps_avx(auVar125,auVar105);
              auVar83 = vsubps_avx(auVar125,auVar79);
              local_9e0 = vblendvps_avx(auVar79,auVar85,local_b60);
              local_a00 = vblendvps_avx(auVar105,auVar83,local_b60);
              local_980._0_4_ = auVar4._0_4_ * (float)local_b80._0_4_;
              local_980._4_4_ = auVar4._4_4_ * (float)local_b80._4_4_;
              local_980._8_4_ = auVar4._8_4_ * fStack_b78;
              local_980._12_4_ = auVar4._12_4_ * fStack_b74;
              local_980._16_4_ = fStack_b70 * 0.0;
              local_980._20_4_ = fStack_b6c * 0.0;
              local_980._24_4_ = fStack_b68 * 0.0;
              local_980._28_4_ = 0;
              local_960._0_4_ = (float)local_b80._0_4_ * fVar1;
              local_960._4_4_ = (float)local_b80._4_4_ * fVar2;
              local_960._8_4_ = fStack_b78 * fVar17;
              local_960._12_4_ = fStack_b74 * fVar18;
              local_960._16_4_ = fStack_b70 * 0.0;
              local_960._20_4_ = fStack_b6c * 0.0;
              local_960._24_4_ = fStack_b68 * 0.0;
              local_960._28_4_ = 0;
              local_9a0[0] = auVar76._0_4_ * (float)local_b80._0_4_;
              local_9a0[1] = auVar76._4_4_ * (float)local_b80._4_4_;
              local_9a0[2] = auVar76._8_4_ * fStack_b78;
              local_9a0[3] = auVar76._12_4_ * fStack_b74;
              fStack_990 = fStack_b70 * 0.0;
              fStack_98c = fStack_b6c * 0.0;
              fStack_988 = fStack_b68 * 0.0;
              uStack_984 = local_a00._28_4_;
              auVar77 = vpsllw_avx(auVar77,0xf);
              auVar77 = vpacksswb_avx(auVar77,auVar77);
              uVar73 = (ulong)(byte)(SUB161(auVar77 >> 7,0) & 1 |
                                     (SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar77 >> 0x3f,0) << 7);
              do {
                uVar54 = 0;
                for (uVar50 = uVar73; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000)
                {
                  uVar54 = uVar54 + 1;
                }
                uVar43 = *(uint *)((long)&local_b20 + uVar54 * 4);
                pGVar12 = (pSVar10->geometries).items[uVar43].ptr;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  uVar73 = uVar73 ^ 1L << (uVar54 & 0x3f);
                  bVar75 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar75 = false;
                }
                else {
                  uVar44 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uVar50 = (ulong)(uint)((int)uVar54 * 4);
                  uVar3 = *(undefined4 *)(local_a00 + uVar50);
                  local_8c0._4_4_ = uVar3;
                  local_8c0._0_4_ = uVar3;
                  local_8c0._8_4_ = uVar3;
                  local_8c0._12_4_ = uVar3;
                  local_8c0._16_4_ = uVar3;
                  local_8c0._20_4_ = uVar3;
                  local_8c0._24_4_ = uVar3;
                  local_8c0._28_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_9e0 + uVar50);
                  local_8a0._4_4_ = uVar3;
                  local_8a0._0_4_ = uVar3;
                  local_8a0._8_4_ = uVar3;
                  local_8a0._12_4_ = uVar3;
                  local_8a0._16_4_ = uVar3;
                  local_8a0._20_4_ = uVar3;
                  local_8a0._24_4_ = uVar3;
                  local_8a0._28_4_ = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_9c0 + uVar50);
                  local_cb0.context = context->user;
                  uVar3 = *(undefined4 *)((long)&local_b40 + uVar50);
                  local_880._4_4_ = uVar3;
                  local_880._0_4_ = uVar3;
                  local_880._8_4_ = uVar3;
                  local_880._12_4_ = uVar3;
                  local_880._16_4_ = uVar3;
                  local_880._20_4_ = uVar3;
                  local_880._24_4_ = uVar3;
                  local_880._28_4_ = uVar3;
                  local_920 = *(undefined4 *)((long)local_9a0 + uVar50);
                  local_900 = *(undefined4 *)(local_980 + uVar50);
                  local_8e0 = *(undefined4 *)(local_960 + uVar50);
                  local_860._4_4_ = uVar43;
                  local_860._0_4_ = uVar43;
                  local_860._8_4_ = uVar43;
                  local_860._12_4_ = uVar43;
                  local_860._16_4_ = uVar43;
                  local_860._20_4_ = uVar43;
                  local_860._24_4_ = uVar43;
                  local_860._28_4_ = uVar43;
                  uStack_91c = local_920;
                  uStack_918 = local_920;
                  uStack_914 = local_920;
                  uStack_910 = local_920;
                  uStack_90c = local_920;
                  uStack_908 = local_920;
                  uStack_904 = local_920;
                  uStack_8fc = local_900;
                  uStack_8f8 = local_900;
                  uStack_8f4 = local_900;
                  uStack_8f0 = local_900;
                  uStack_8ec = local_900;
                  uStack_8e8 = local_900;
                  uStack_8e4 = local_900;
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  vpcmpeqd_avx2(local_8c0,local_8c0);
                  uStack_83c = (local_cb0.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_cb0.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_c80 = local_ba0._0_8_;
                  uStack_c78 = local_ba0._8_8_;
                  uStack_c70 = local_ba0._16_8_;
                  uStack_c68 = local_ba0._24_8_;
                  local_cb0.valid = (int *)&local_c80;
                  local_cb0.geometryUserPtr = pGVar12->userPtr;
                  local_cb0.hit = (RTCHitN *)&local_920;
                  local_cb0.N = 8;
                  local_cb0.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&local_cb0);
                  }
                  auVar41._8_8_ = uStack_c78;
                  auVar41._0_8_ = local_c80;
                  auVar41._16_8_ = uStack_c70;
                  auVar41._24_8_ = uStack_c68;
                  auVar79 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar41);
                  auVar105 = _DAT_0205a980 & ~auVar79;
                  if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar105 >> 0x7f,0) == '\0') &&
                        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar105 >> 0xbf,0) == '\0') &&
                      (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar105[0x1f]) {
                    auVar79 = auVar79 ^ _DAT_0205a980;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_cb0);
                    }
                    auVar42._8_8_ = uStack_c78;
                    auVar42._0_8_ = local_c80;
                    auVar42._16_8_ = uStack_c70;
                    auVar42._24_8_ = uStack_c68;
                    auVar105 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar42);
                    auVar79 = auVar105 ^ _DAT_0205a980;
                    auVar89._8_4_ = 0xff800000;
                    auVar89._0_8_ = 0xff800000ff800000;
                    auVar89._12_4_ = 0xff800000;
                    auVar89._16_4_ = 0xff800000;
                    auVar89._20_4_ = 0xff800000;
                    auVar89._24_4_ = 0xff800000;
                    auVar89._28_4_ = 0xff800000;
                    auVar105 = vblendvps_avx(auVar89,*(undefined1 (*) [32])(local_cb0.ray + 0x100),
                                             auVar105);
                    *(undefined1 (*) [32])(local_cb0.ray + 0x100) = auVar105;
                  }
                  bVar39 = (auVar79 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar40 = (auVar79 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar38 = (auVar79 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar37 = SUB321(auVar79 >> 0x7f,0) == '\0';
                  bVar36 = (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar35 = SUB321(auVar79 >> 0xbf,0) == '\0';
                  bVar34 = (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar33 = -1 < auVar79[0x1f];
                  bVar75 = ((((((bVar39 && bVar40) && bVar38) && bVar37) && bVar36) && bVar35) &&
                           bVar34) && bVar33;
                  if (((((((bVar39 && bVar40) && bVar38) && bVar37) && bVar36) && bVar35) && bVar34)
                      && bVar33) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar44;
                    uVar73 = uVar73 ^ 1L << (uVar54 & 0x3f);
                  }
                }
                uVar43 = 0;
                if (!bVar75) {
                  if (bVar74) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar43 = 1;
                  }
                  goto LAB_005ff563;
                }
              } while (uVar73 != 0);
            }
          }
          uVar69 = uVar69 + 1;
          bVar74 = uVar69 < uVar46;
        } while (uVar69 != uVar46);
        uVar43 = 0;
      }
    }
LAB_005ff563:
  } while ((uVar43 & 3) == 0);
  return puVar52 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }